

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

unsigned_long_long ZSTD_decompressBound(void *src,size_t srcSize)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  ZSTD_frameSizeInfo ZVar3;
  
  if (srcSize == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      ZVar3 = ZSTD_findFrameSizeInfo(src,srcSize);
      uVar1 = ZVar3.compressedSize;
      if (0xffffffffffffff88 < uVar1) {
        return 0xfffffffffffffffe;
      }
      if (ZVar3.decompressedBound == 0xfffffffffffffffe) {
        return 0xfffffffffffffffe;
      }
      if (srcSize < uVar1) {
        __assert_fail("srcSize >= compressedSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5bc9,"unsigned long long ZSTD_decompressBound(const void *, size_t)");
      }
      src = (void *)((long)src + uVar1);
      uVar2 = uVar2 + ZVar3.decompressedBound;
      srcSize = srcSize - uVar1;
    } while (srcSize != 0);
  }
  return uVar2;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}